

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcBlendEquationAdvancedTests.cpp
# Opt level: O2

int __thiscall
glcts::MissingQualifierTestGroup::init(MissingQualifierTestGroup *this,EVP_PKEY_CTX *ctx)

{
  undefined8 in_RAX;
  long lVar1;
  char *layoutQualifier;
  MissingCase *this_00;
  undefined8 extraout_RAX;
  GLenum *pGVar2;
  long lVar3;
  
  pGVar2 = &s_modes;
  for (lVar3 = 1; lVar3 != 0x10; lVar3 = lVar3 + 1) {
    if (this->m_missingType == MISSING) {
      layoutQualifier = (char *)0x0;
    }
    else {
      lVar1 = 0;
      if (lVar3 != 0xf) {
        lVar1 = lVar3;
      }
      layoutQualifier = GetLayoutQualifierStr((&s_modes)[lVar1]);
    }
    this_00 = (MissingCase *)operator_new(0x88);
    MissingCase::MissingCase
              (this_00,(this->super_TestCaseGroup).m_context,this->m_glslVersion,*pGVar2,
               layoutQualifier);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    pGVar2 = pGVar2 + 1;
    in_RAX = extraout_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void init(void)
	{
		// Pump individual modes.
		for (int i = 0; i < DE_LENGTH_OF_ARRAY(s_modes); i++)
		{
			const char* qualifier = m_missingType == MISSING ?
										DE_NULL :
										GetLayoutQualifierStr(s_modes[(i + 1) % DE_LENGTH_OF_ARRAY(s_modes)]);
			addChild(new MissingCase(m_context, m_glslVersion, s_modes[i], qualifier));
		}
	}